

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpvBuilder.cpp
# Opt level: O2

void __thiscall spv::Builder::If::makeBeginElse(If *this)

{
  Builder *pBVar1;
  Block *this_00;
  Id id;
  
  createBranch(this->builder,true,this->mergeBlock);
  this_00 = (Block *)::operator_new(0x90);
  id = this->builder->uniqueId + 1;
  this->builder->uniqueId = id;
  Block::Block(this_00,id,this->function);
  this->elseBlock = this_00;
  spv::Function::addBlock(this->function,this_00);
  pBVar1 = this->builder;
  pBVar1->buildPoint = this->elseBlock;
  pBVar1->dirtyLineTracker = true;
  pBVar1->dirtyScopeTracker = true;
  return;
}

Assistant:

void Builder::If::makeBeginElse()
{
    // Close out the "then" by having it jump to the mergeBlock
    builder.createBranch(true, mergeBlock);

    // Make the first else block and add it to the function
    elseBlock = new Block(builder.getUniqueId(), *function);
    function->addBlock(elseBlock);

    // Start building the else block
    builder.setBuildPoint(elseBlock);
}